

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O1

ParquetColumnDefinition *
duckdb::ParquetColumnDefinition::Deserialize
          (ParquetColumnDefinition *__return_storage_ptr__,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  uint uVar2;
  int iVar3;
  Value local_c8;
  LogicalType local_88;
  Value local_70;
  
  ParquetColumnDefinition(__return_storage_ptr__);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"field_id");
  iVar3 = 0;
  if ((char)uVar2 != '\0') {
    iVar3 = (*deserializer->_vptr_Deserializer[0x12])(deserializer);
  }
  __return_storage_ptr__->field_id = iVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"name");
  if ((char)uVar2 == '\0') {
    pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_c8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         0;
    local_c8.type_._0_8_ = pp_Var1;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_c8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_c8.type_._0_8_ == pp_Var1)
    goto LAB_01b98465;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_c8,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_c8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c8.type_._0_8_ ==
        &local_c8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    goto LAB_01b98465;
  }
  operator_delete((void *)local_c8.type_._0_8_);
LAB_01b98465:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x67,"type",&__return_storage_ptr__->type);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x68,"default_value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_c8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&__return_storage_ptr__->default_value,&local_c8);
  Value::~Value(&local_c8);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_70,&local_88);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"identifier");
  if ((char)uVar2 == '\0') {
    Value::operator=(&__return_storage_ptr__->identifier,&local_70);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Value::Deserialize(&local_c8,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    Value::operator=(&__return_storage_ptr__->identifier,&local_c8);
    Value::~Value(&local_c8);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  Value::~Value(&local_70);
  LogicalType::~LogicalType(&local_88);
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnDefinition ParquetColumnDefinition::Deserialize(Deserializer &deserializer) {
	ParquetColumnDefinition result;
	deserializer.ReadPropertyWithDefault<int32_t>(100, "field_id", result.field_id);
	deserializer.ReadPropertyWithDefault<string>(101, "name", result.name);
	deserializer.ReadProperty<LogicalType>(103, "type", result.type);
	deserializer.ReadProperty<Value>(104, "default_value", result.default_value);
	deserializer.ReadPropertyWithExplicitDefault<Value>(105, "identifier", result.identifier, Value());
	return result;
}